

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O1

int gdTransformAffineGetImage(gdImagePtr *dst,gdImagePtr src,gdRectPtr src_area,double *affine)

{
  int iVar1;
  gdImagePtr pgVar2;
  gdRect bbox;
  gdRect area_full;
  double m [6];
  gdRect local_78;
  gdRect local_68;
  double local_58 [6];
  
  if (src_area == (gdRectPtr)0x0) {
    src_area = &local_68;
    local_68.x = 0;
    local_68.y = 0;
    local_68.width = src->sx;
    local_68.height = src->sy;
  }
  gdTransformAffineBoundingBox(src_area,affine,&local_78);
  pgVar2 = gdImageCreateTrueColor(local_78.width,local_78.height);
  *dst = pgVar2;
  if (pgVar2 != (gdImagePtr)0x0) {
    pgVar2->saveAlphaFlag = 1;
    if (src->trueColor == 0) {
      gdImagePaletteToTrueColor(src);
    }
    gdAffineTranslate(local_58,(double)-local_78.x,(double)-local_78.y);
    gdAffineConcat(local_58,affine,local_58);
    gdImageAlphaBlending(*dst,0);
    iVar1 = gdTransformAffineCopy(*dst,0,0,src,src_area,local_58);
    if (iVar1 != 0) {
      return 1;
    }
    gdImageDestroy(*dst);
    *dst = (gdImagePtr)0x0;
  }
  return 0;
}

Assistant:

BGD_DECLARE(int) gdTransformAffineGetImage(gdImagePtr *dst,
		  const gdImagePtr src,
		  gdRectPtr src_area,
		  const double affine[6])
{
	int res;
	double m[6];
	gdRect bbox;
	gdRect area_full;

	if (src_area == NULL) {
		area_full.x = 0;
		area_full.y = 0;
		area_full.width  = gdImageSX(src);
		area_full.height = gdImageSY(src);
		src_area = &area_full;
	}

	gdTransformAffineBoundingBox(src_area, affine, &bbox);

	*dst = gdImageCreateTrueColor(bbox.width, bbox.height);
	if (*dst == NULL) {
		return GD_FALSE;
	}
	(*dst)->saveAlphaFlag = 1;

	if (!src->trueColor) {
		gdImagePaletteToTrueColor(src);
	}
	
	/* Translate to dst origin (0,0) */
	gdAffineTranslate(m, -bbox.x, -bbox.y);
	gdAffineConcat(m, affine, m);

	gdImageAlphaBlending(*dst, 0);

	res = gdTransformAffineCopy(*dst,
		  0,0,
		  src,
		  src_area,
		  m);

	if (res != GD_TRUE) {
		gdImageDestroy(*dst);
		*dst = NULL;
		return GD_FALSE;
	} else {
		return GD_TRUE;
	}
}